

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O2

void __thiscall
Triangle::Triangle(Triangle *this,vec3f v1,vec3f v2,vec3f v3,vec2f vt1,vec2f vt2,vec2f vt3,vec3f vn1
                  ,vec3f vn2,vec3f vn3)

{
  undefined1 auVar1 [16];
  mat3f a;
  float (*pafVar2) [3];
  float fVar3;
  float in_XMM2_Dc;
  float in_XMM2_Dd;
  float fVar4;
  float fVar5;
  vec3f vVar6;
  vec3f local_b8;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  vec3f local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  vec3f local_58;
  vec3f local_48;
  undefined4 uStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  float local_28;
  
  fVar5 = v1.z;
  fStack_6c = v1.x;
  fStack_5c = v1.y;
  (this->super_BasicPrimitive).super_Primitive._vptr_Primitive =
       (_func_int **)&PTR_intersect_00160560;
  (this->v1).x = (float)(int)v1._0_8_;
  (this->v1).y = (float)(int)((ulong)v1._0_8_ >> 0x20);
  (this->v1).z = fVar5;
  (this->v2).x = (float)(int)v2._0_8_;
  (this->v2).y = (float)(int)((ulong)v2._0_8_ >> 0x20);
  (this->v2).z = v2.z;
  (this->v3).x = (float)(int)v3._0_8_;
  (this->v3).y = (float)(int)((ulong)v3._0_8_ >> 0x20);
  (this->v3).z = v3.z;
  (this->vn1).z = vn1.z;
  (this->vn1).x = vn1.x;
  (this->vn1).y = vn1.y;
  (this->vn2).x = vn2.x;
  (this->vn2).y = vn2.y;
  (this->vn2).z = vn2.z;
  (this->vn3).x = vn3.x;
  (this->vn3).y = vn3.y;
  (this->vn3).z = vn3.z;
  auVar1._8_4_ = vt2.x;
  auVar1._0_8_ = vt1;
  auVar1._12_4_ = vt2.y;
  this->vt1 = vt1;
  (this->vt2).x = (float)(int)auVar1._8_8_;
  (this->vt2).y = (float)(int)((ulong)auVar1._8_8_ >> 0x20);
  this->vt3 = vt3;
  *(float *)((long)((this->tMatrix).data + 0) + 0) = 0.0;
  *(float *)((long)((this->tMatrix).data + 0) + 4) = 0.0;
  *(undefined8 *)((this->tMatrix).data[0] + 2) = 0;
  pafVar2 = (this->tMatrix).data;
  *(float *)((long)(pafVar2 + 1) + 4) = 0.0;
  *(float *)((long)(pafVar2 + 1) + 8) = 0.0;
  *(float *)((long)((this->tMatrix).data + 2) + 0) = 0.0;
  *(float *)((long)((this->tMatrix).data + 2) + 4) = 0.0;
  *(undefined8 *)((this->tMatrix).data[2] + 2) = 0;
  (this->planeNormal).y = 0.0;
  (this->planeNormal).z = 0.0;
  fVar4 = v2.z - fVar5;
  local_98 = v2.x - fStack_6c;
  local_a8 = v3.x - fStack_6c;
  fStack_70 = v2.y - fStack_6c;
  fStack_6c = v3.y - fStack_6c;
  fStack_94 = v2.y - fStack_5c;
  fStack_a4 = v3.y - fStack_5c;
  fStack_60 = in_XMM2_Dc - fStack_5c;
  fStack_5c = in_XMM2_Dd - fStack_5c;
  local_b8.y = fStack_94;
  local_b8.x = local_98;
  fVar5 = v3.z - fVar5;
  local_88.y = fStack_a4;
  local_88.x = local_a8;
  local_b8.z = fVar4;
  fStack_a0 = local_a8;
  fStack_9c = local_a8;
  fStack_90 = local_a8;
  fStack_8c = fStack_a4;
  local_88.z = fVar5;
  local_78 = local_98;
  fStack_74 = local_a8;
  local_68 = fStack_94;
  fStack_64 = fStack_a4;
  vVar6 = cross(&local_b8,&local_88);
  local_48.z = vVar6.z;
  local_48._0_8_ = vVar6._0_8_;
  vVar6 = normalized(&local_48);
  (this->planeNormal).x = (float)(int)vVar6._0_8_;
  (this->planeNormal).y = (float)(int)((ulong)vVar6._0_8_ >> 0x20);
  (this->planeNormal).z = vVar6.z;
  fVar3 = dot(&this->planeNormal,&vn1);
  if (fVar3 < 0.0) {
    operator*=(&this->planeNormal,-1.0);
  }
  local_48.y = fStack_a4;
  local_48.x = local_a8;
  local_b8.y = fStack_94;
  local_b8.x = local_98;
  local_b8.z = fVar4;
  local_48.z = fVar5;
  vVar6 = cross(&local_48,&local_b8);
  this->one_by_2S = 1.0 / SQRT(vVar6.z * vVar6.z + vVar6.x * vVar6.x + vVar6.y * vVar6.y);
  local_b8.y = fStack_94;
  local_b8.x = local_98;
  local_58.y = fStack_a4;
  local_58.x = local_a8;
  local_b8.z = fVar4;
  local_58.z = fVar5;
  vVar6 = normalized(&local_58);
  local_88.z = vVar6.z;
  local_88._0_8_ = vVar6._0_8_;
  vVar6 = cross(&local_b8,&local_88);
  a.data[1][0] = fStack_74;
  a.data[0][2] = local_78;
  a.data[0][1] = fVar5;
  a.data[0][0] = fVar4;
  a.data[1][1] = vVar6.x;
  a.data[1][2] = local_68;
  a.data[2][0] = fStack_64;
  a.data[2][1] = vVar6.y;
  a.data[2][2] = fVar4;
  inverse(a);
  (this->tMatrix).data[2][2] = local_28;
  *(undefined8 *)((this->tMatrix).data[1] + 1) = local_38;
  *(undefined8 *)(this->tMatrix).data[2] = uStack_30;
  *(float *)((long)((this->tMatrix).data + 0) + 0) = local_48.x;
  *(float *)((long)((this->tMatrix).data + 0) + 4) = local_48.y;
  *(ulong *)((this->tMatrix).data[0] + 2) = CONCAT44(uStack_3c,local_48.z);
  return;
}

Assistant:

Triangle(vec3f v1, vec3f v2, vec3f v3, vec2f vt1, vec2f vt2, vec2f vt3, vec3f vn1, vec3f vn2, vec3f vn3):
		v1(v1), v2(v2), v3(v3), vn1(vn1), vn2(vn2), vn3(vn3), vt1(vt1), vt2(vt2), vt3(vt3)
	// pre-calculation to accelerate intersection / interpolation computation
	{
		// NOTE: be careful when dealing with tiny triangles!
		assert(norm(v1-v2)>0);
		assert(norm(v1-v3)>0);
		assert(norm(v2-v3)>0);
		assert(norm(cross(normalized(v2-v1), normalized(v3-v1))) > 1e-9);

		planeNormal = normalized(cross(v2-v1, v3-v1));
		// make sure plane normal points outward
		if (dot(planeNormal, vn1) < 0)
			planeNormal *= -1;
		one_by_2S = 1 / norm(cross(v3-v1, v2-v1));
		tMatrix = inverse(mat3f(v2-v1, v3-v1, cross(v2-v1, normalized(v3-v1))));
	}